

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall
cppcms::widgets::base_widget::generate(base_widget *this,int position,form_context *param_2)

{
  uint uVar1;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  uVar1 = *(uint *)&this->field_0x1f0;
  if ((uVar1 & 0x10) == 0) {
    if ((this->name_)._M_string_length == 0) {
      impl::todec_string<int>(&local_50,position);
      std::operator+(&local_30,"_",&local_50);
      std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
      uVar1 = *(uint *)&this->field_0x1f0;
    }
    *(uint *)&this->field_0x1f0 = uVar1 | 0x10;
  }
  return;
}

Assistant:

void base_widget::generate(int position,form_context * /*context*/)
{
	if(is_generation_done_)
		return;
	if(name_.empty()) {
		name_ = "_" + impl::todec_string(position);
	}
	is_generation_done_ = 1;
}